

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  char *__s;
  char *pcVar6;
  unsigned_long uVar7;
  long lVar8;
  cmake *pcVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  cmSourceFile *this_00;
  unsigned_long dindex;
  Directory dir;
  string sourceListValue;
  string file;
  string templateDirectory;
  string tdir;
  string fullname;
  string ext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcExts;
  string base;
  Directory local_160;
  string local_158;
  string local_138;
  long *local_118;
  long local_110;
  long local_108 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  char *local_f0;
  char *local_e8;
  char local_e0;
  undefined7 uStack_df;
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  long local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  local_f8 = args;
  if (local_70 == 0x40) {
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_118 = local_108;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar3,pcVar3 + pbVar2->_M_string_length);
    local_f0 = &local_e0;
    local_e8 = (char *)0x0;
    local_e0 = '\0';
    bVar5 = cmsys::SystemTools::FileIsFullPath((char *)local_118);
    if (bVar5) {
      std::__cxx11::string::_M_assign((string *)&local_f0);
    }
    else {
      __s = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      pcVar6 = local_e8;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_f0,0,pcVar6,(ulong)__s);
      std::__cxx11::string::append((char *)&local_f0);
      std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_118);
    }
    pcVar6 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (local_f8->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    sVar4 = local_158._M_string_length;
    if (pcVar6 != (char *)0x0) {
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)sVar4,(ulong)pcVar6);
    }
    cmsys::Directory::Directory(&local_160);
    std::__cxx11::string::string((string *)&local_138,local_f0,(allocator *)local_b0);
    bVar5 = cmsys::Directory::Load(&local_160,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((bVar5) && (uVar7 = cmsys::Directory::GetNumberOfFiles(&local_160), uVar7 != 0)) {
      dindex = 0;
      do {
        pcVar6 = cmsys::Directory::GetFile(&local_160,dindex);
        std::__cxx11::string::string((string *)&local_138,pcVar6,(allocator *)local_b0);
        lVar8 = std::__cxx11::string::rfind((char *)&local_138,0x4c29c4,0xffffffffffffffff);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_138);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_138);
          pcVar9 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_68,&pcVar9->SourceFileExtensions);
          if ((local_48 != 0) &&
             (_Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (local_68.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_68.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,local_b0),
             _Var10._M_current !=
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_118,(long)local_118 + local_110);
            std::__cxx11::string::append((char *)&local_d0);
            std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_138._M_dataplus._M_p);
            this_00 = cmMakefile::GetOrCreateSource
                                ((this->super_cmCommand).Makefile,&local_d0,false);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ABSTRACT","");
            cmSourceFile::SetProperty(this_00,&local_90,"0");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((char *)local_158._M_string_length != (char *)0x0) {
              std::__cxx11::string::append((char *)&local_158);
            }
            std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        dindex = dindex + 1;
      } while (uVar7 != dindex);
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (local_f8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,local_158._M_dataplus._M_p);
    cmsys::Directory::~Directory(&local_160);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_002d6a3b;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == paVar1) goto LAB_002d6a3b;
  }
  operator_delete(local_158._M_dataplus._M_p,
                  CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                           local_158.field_2._M_local_buf[0]) + 1);
LAB_002d6a3b:
  return local_70 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string sourceListValue;
  std::string templateDirectory = args[0];
  std::string tdir;
  if(!cmSystemTools::FileIsFullPath(templateDirectory.c_str()))
    {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
    }
  else
    {
    tdir = templateDirectory;
    }

  // was the list already populated
  const char *def = this->Makefile->GetDefinition(args[1]);
  if (def)
    {
    sourceListValue = def;
    }

  // Load all the files in the directory
  cmsys::Directory dir;
  if(dir.Load(tdir.c_str()))
    {
    size_t numfiles = dir.GetNumberOfFiles();
    for(size_t i =0; i < numfiles; ++i)
      {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind(".");
      if( dotpos != std::string::npos )
        {
        std::string ext = file.substr(dotpos+1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        std::vector<std::string> srcExts =
            this->Makefile->GetCMakeInstance()->GetSourceExtensions();
        if(!base.empty() &&
           std::find(srcExts.begin(), srcExts.end(), ext) != srcExts.end())
          {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf =
            this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT","0");
          if(!sourceListValue.empty())
            {
            sourceListValue += ";";
            }
          sourceListValue += fullname;
          }
        }
      }
    }
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}